

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.h
# Opt level: O0

int __thiscall CVmImageFileExt::dup(CVmImageFileExt *this,int __fd)

{
  int iVar1;
  undefined4 extraout_var;
  CVmFile *fp;
  CVmFile *fpdup;
  CVmImageFileExt *in_stack_ffffffffffffffd0;
  int local_8;
  
  iVar1 = CVmFile::dup(this->fp_,__fd);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_8 = 0;
  }
  else {
    fp = (CVmFile *)operator_new(0x20);
    CVmImageFileExt(in_stack_ffffffffffffffd0,fp);
    local_8 = (int)fp;
  }
  return local_8;
}

Assistant:

virtual CVmImageFile *dup(const char *mode)
    {
        /* duplicate our file handle */
        CVmFile *fpdup = fp_->dup(mode);
        if (fpdup == 0)
            return 0;

        /* return a new wrapper object for the duplicate handle */
        return new CVmImageFileExt(fpdup);
    }